

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_lookup_cache.hpp
# Opt level: O3

void __thiscall
duckdb::DateLookupCache<duckdb::DatePart::MonthOperator>::BuildCache
          (DateLookupCache<duckdb::DatePart::MonthOperator> *this)

{
  _Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_> _Var1;
  int32_t iVar2;
  _Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_> _Var3;
  int32_t d;
  long lVar4;
  
  _Var3.super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl =
       (_Head_base<0UL,_unsigned_short_*,_false>)operator_new__(0xe720);
  _Var1.super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl =
       (this->cache).super_unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>._M_t
       .super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
       super__Head_base<0UL,_unsigned_short_*,_false>;
  (this->cache).super_unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
  super__Head_base<0UL,_unsigned_short_*,_false> =
       _Var3.super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
  if (_Var1.super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl != (unsigned_short *)0x0) {
    operator_delete__((void *)_Var1.super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl);
  }
  lVar4 = 0;
  do {
    iVar2 = Date::ExtractMonth((date_t)(int32_t)lVar4);
    *(short *)((long)(this->cache).
                     super_unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>._M_t
                     .super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                     .super__Head_base<0UL,_unsigned_short_*,_false> + lVar4 * 2) = (short)iVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x7390);
  return;
}

Assistant:

void BuildCache() {
		D_ASSERT(CACHE_MAX_DATE > CACHE_MIN_DATE);
		cache = make_unsafe_uniq_array_uninitialized<CACHE_TYPE>(CACHE_MAX_DATE - CACHE_MIN_DATE);
		for (int32_t d = CACHE_MIN_DATE; d < CACHE_MAX_DATE; d++) {
			date_t date(d);
			auto cache_entry = OP::template Operation<date_t, int64_t>(date);
			cache[GetDateCacheEntry(date)] = UnsafeNumericCast<CACHE_TYPE>(cache_entry);
		}
	}